

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STAmount.cpp
# Opt level: O0

STAmount *
jbcoin::mulRound(STAmount *__return_storage_ptr__,STAmount *v1,STAmount *v2,Issue *issue,
                bool roundUp)

{
  bool bVar1;
  bool bVar2;
  int64_t iVar3;
  int64_t iVar4;
  SField *name;
  bool *pbVar5;
  uint64_t rounding;
  ulong local_158;
  uint64_t local_148;
  undefined1 local_110 [8];
  STAmount result;
  uint64_t uStack_c0;
  int offset;
  uint64_t amount;
  int local_b0;
  int iStack_ac;
  bool resultNegative;
  int offset2;
  int offset1;
  uint64_t value2;
  uint64_t value1;
  uint64_t maxV;
  uint64_t minV;
  STAmount local_78;
  byte local_2c;
  byte local_29;
  bool xrp;
  Issue *pIStack_28;
  bool roundUp_local;
  Issue *issue_local;
  STAmount *v2_local;
  STAmount *v1_local;
  
  local_29 = roundUp;
  pIStack_28 = issue;
  issue_local = (Issue *)v2;
  v2_local = v1;
  v1_local = __return_storage_ptr__;
  bVar1 = beast::operator==(v1);
  if ((bVar1) || (bVar1 = beast::operator==(issue_local), bVar1)) {
    STAmount::STAmount(__return_storage_ptr__,pIStack_28,0,0,false);
  }
  else {
    STAmount::STAmount(&local_78,pIStack_28,0,0,false);
    bVar1 = isXRP(&local_78);
    STAmount::~STAmount(&local_78);
    local_2c = bVar1;
    bVar1 = STAmount::native(v2_local);
    if ((bVar1) &&
       ((bVar1 = STAmount::native((STAmount *)issue_local), bVar1 && ((local_2c & 1) != 0)))) {
      iVar3 = getSNValue(v2_local);
      iVar4 = getSNValue((STAmount *)issue_local);
      if (iVar3 < iVar4) {
        local_148 = getSNValue(v2_local);
      }
      else {
        local_148 = getSNValue((STAmount *)issue_local);
      }
      maxV = local_148;
      iVar3 = getSNValue(v2_local);
      iVar4 = getSNValue((STAmount *)issue_local);
      if (iVar3 < iVar4) {
        local_158 = getSNValue((STAmount *)issue_local);
      }
      else {
        local_158 = getSNValue(v2_local);
      }
      value1 = local_158;
      if (3000000000 < maxV) {
        Throw<std::runtime_error,char_const(&)[22]>((char (*) [22])"Native value overflow");
      }
      if (0x7ce66c50 < (local_158 >> 0x20) * maxV) {
        Throw<std::runtime_error,char_const(&)[22]>((char (*) [22])"Native value overflow");
      }
      name = STBase::getFName(&v2_local->super_STBase);
      STAmount::STAmount(__return_storage_ptr__,name,maxV * value1,false);
    }
    else {
      value2 = STAmount::mantissa(v2_local);
      _offset2 = STAmount::mantissa((STAmount *)issue_local);
      iStack_ac = STAmount::exponent(v2_local);
      local_b0 = STAmount::exponent((STAmount *)issue_local);
      bVar1 = STAmount::native(v2_local);
      if (bVar1) {
        for (; value2 < 1000000000000000; value2 = value2 * 10) {
          iStack_ac = iStack_ac + -1;
        }
      }
      bVar1 = STAmount::native((STAmount *)issue_local);
      if (bVar1) {
        for (; _offset2 < 1000000000000000; _offset2 = _offset2 * 10) {
          local_b0 = local_b0 + -1;
        }
      }
      bVar1 = STAmount::negative(v2_local);
      bVar2 = STAmount::negative((STAmount *)issue_local);
      amount._7_1_ = bVar1 != bVar2;
      rounding = 0;
      if (amount._7_1_ != (local_29 & 1)) {
        rounding = 99999999999999;
      }
      uStack_c0 = muldiv_round(value2,_offset2,100000000000000,rounding);
      result._68_4_ = iStack_ac + local_b0 + 0xe;
      if ((amount._7_1_ & 1) != (local_29 & 1)) {
        canonicalizeRound((bool)(local_2c & 1),&stack0xffffffffffffff40,(int *)&result.mIsNative);
      }
      STAmount::STAmount((STAmount *)local_110,pIStack_28,uStack_c0,result._68_4_,
                         (bool)(amount._7_1_ & 1));
      if (((((local_29 & 1) == 0) || ((amount._7_1_ & 1) != 0)) ||
          (bVar1 = STAmount::operator_cast_to_bool((STAmount *)local_110), bVar1)) ||
         (pbVar5 = LocalValue<bool>::operator*((LocalValue<bool> *)&stAmountCalcSwitchover),
         (*pbVar5 & 1U) == 0)) {
        STAmount::STAmount(__return_storage_ptr__,(STAmount *)local_110);
      }
      else {
        if (((local_2c & 1) == 0) ||
           (pbVar5 = LocalValue<bool>::operator*((LocalValue<bool> *)&stAmountCalcSwitchover2),
           (*pbVar5 & 1U) == 0)) {
          uStack_c0 = 1000000000000000;
          result.mIsNative = true;
          result.mIsNegative = true;
          result._70_2_ = 0xffff;
        }
        else {
          uStack_c0 = 1;
          result.mIsNative = false;
          result.mIsNegative = false;
          result._70_2_ = 0;
        }
        STAmount::STAmount(__return_storage_ptr__,pIStack_28,uStack_c0,result._68_4_,
                           (bool)(amount._7_1_ & 1));
      }
      STAmount::~STAmount((STAmount *)local_110);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

STAmount
mulRound (STAmount const& v1, STAmount const& v2, Issue const& issue,
    bool roundUp)
{
    if (v1 == zero || v2 == zero)
        return {issue};

    bool const xrp = isXRP (issue);

    if (v1.native() && v2.native() && xrp)
    {
        std::uint64_t minV = (getSNValue (v1) < getSNValue (v2)) ?
                getSNValue (v1) : getSNValue (v2);
        std::uint64_t maxV = (getSNValue (v1) < getSNValue (v2)) ?
                getSNValue (v2) : getSNValue (v1);

        if (minV > 3000000000ull) // sqrt(cMaxNative)
            Throw<std::runtime_error> ("Native value overflow");

        if (((maxV >> 32) * minV) > 2095475792ull) // cMaxNative / 2^32
            Throw<std::runtime_error> ("Native value overflow");

        return STAmount (v1.getFName (), minV * maxV);
    }

    std::uint64_t value1 = v1.mantissa(), value2 = v2.mantissa();
    int offset1 = v1.exponent(), offset2 = v2.exponent();

    if (v1.native())
    {
        while (value1 < STAmount::cMinValue)
        {
            value1 *= 10;
            --offset1;
        }
    }

    if (v2.native())
    {
        while (value2 < STAmount::cMinValue)
        {
            value2 *= 10;
            --offset2;
        }
    }

    bool const resultNegative = v1.negative() != v2.negative();

    // We multiply the two mantissas (each is between 10^15
    // and 10^16), so their product is in the 10^30 to 10^32
    // range. Dividing their product by 10^14 maintains the
    // precision, by scaling the result to 10^16 to 10^18.
    //
    // If the we're rounding up, we want to round up away
    // from zero, and if we're rounding down, truncation
    // is implicit.
    std::uint64_t amount = muldiv_round (
        value1, value2, tenTo14,
        (resultNegative != roundUp) ? tenTo14m1 : 0);

    int offset = offset1 + offset2 + 14;
    if (resultNegative != roundUp)
        canonicalizeRound (xrp, amount, offset);
    STAmount result (issue, amount, offset, resultNegative);

    // Control when bugfixes that require switchover dates are enabled
    if (roundUp && !resultNegative && !result && *stAmountCalcSwitchover)
    {
        if (xrp && *stAmountCalcSwitchover2)
        {
            // return the smallest value above zero
            amount = 1;
            offset = 0;
        }
        else
        {
            // return the smallest value above zero
            amount = STAmount::cMinValue;
            offset = STAmount::cMinOffset;
        }
        return STAmount(issue, amount, offset, resultNegative);
    }
    return result;
}